

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcDfs.c
# Opt level: O3

Vec_Ptr_t * Abc_NtkDfsIterNodes(Abc_Ntk_t *pNtk,Vec_Ptr_t *vRoots)

{
  ulong uVar1;
  int iVar2;
  Abc_Ntk_t *pAVar3;
  int *__s;
  Vec_Ptr_t *vNodes;
  void **ppvVar4;
  Vec_Ptr_t *vStack;
  undefined8 extraout_RDX;
  undefined8 extraout_RDX_00;
  undefined8 extraout_RDX_01;
  undefined8 uVar5;
  Abc_Obj_t *pRoot;
  long lVar6;
  int iVar7;
  
  if ((pNtk->vTravIds).pArray == (int *)0x0) {
    iVar2 = pNtk->vObjs->nSize;
    uVar1 = (long)iVar2 + 500;
    iVar7 = (int)uVar1;
    if ((pNtk->vTravIds).nCap < iVar7) {
      __s = (int *)malloc(uVar1 * 4);
      (pNtk->vTravIds).pArray = __s;
      if (__s == (int *)0x0) {
        __assert_fail("p->pArray",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecInt.h"
                      ,0x217,"void Vec_IntGrow(Vec_Int_t *, int)");
      }
      (pNtk->vTravIds).nCap = iVar7;
    }
    else {
      __s = (int *)0x0;
    }
    if (-500 < iVar2) {
      memset(__s,0,(uVar1 & 0xffffffff) << 2);
    }
    (pNtk->vTravIds).nSize = iVar7;
  }
  iVar2 = pNtk->nTravIds;
  pNtk->nTravIds = iVar2 + 1;
  if (iVar2 < 0x3fffffff) {
    vNodes = (Vec_Ptr_t *)malloc(0x10);
    vNodes->nCap = 1000;
    vNodes->nSize = 0;
    ppvVar4 = (void **)malloc(8000);
    vNodes->pArray = ppvVar4;
    vStack = (Vec_Ptr_t *)malloc(0x10);
    vStack->nCap = 1000;
    vStack->nSize = 0;
    ppvVar4 = (void **)malloc(8000);
    vStack->pArray = ppvVar4;
    if (0 < vRoots->nSize) {
      lVar6 = 0;
      uVar5 = extraout_RDX;
      do {
        pRoot = (Abc_Obj_t *)((ulong)vRoots->pArray[lVar6] & 0xfffffffffffffffe);
        pAVar3 = pRoot->pNtk;
        iVar2 = pRoot->Id;
        Vec_IntFillExtra(&pAVar3->vTravIds,iVar2 + 1,(int)uVar5);
        if (((long)iVar2 < 0) || ((pAVar3->vTravIds).nSize <= iVar2)) {
          __assert_fail("i >= 0 && i < p->nSize",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecInt.h"
                        ,0x1a9,"int Vec_IntEntry(Vec_Int_t *, int)");
        }
        uVar5 = extraout_RDX_00;
        if ((pAVar3->vTravIds).pArray[iVar2] != pRoot->pNtk->nTravIds) {
          Abc_NtkDfs_iter(vStack,pRoot,vNodes);
          uVar5 = extraout_RDX_01;
        }
        lVar6 = lVar6 + 1;
      } while (lVar6 < vRoots->nSize);
      ppvVar4 = vStack->pArray;
    }
    if (ppvVar4 != (void **)0x0) {
      free(ppvVar4);
    }
    free(vStack);
    return vNodes;
  }
  __assert_fail("p->nTravIds < (1<<30)",
                "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/base/abc/abc.h"
                ,0x198,"void Abc_NtkIncrementTravId(Abc_Ntk_t *)");
}

Assistant:

Vec_Ptr_t * Abc_NtkDfsIterNodes( Abc_Ntk_t * pNtk, Vec_Ptr_t * vRoots )
{
    Vec_Ptr_t * vNodes, * vStack;
    Abc_Obj_t * pObj;
    int i;
    Abc_NtkIncrementTravId( pNtk );
    vNodes = Vec_PtrAlloc( 1000 );
    vStack = Vec_PtrAlloc( 1000 );
    Vec_PtrForEachEntry( Abc_Obj_t *, vRoots, pObj, i )
        if ( !Abc_NodeIsTravIdCurrent(Abc_ObjRegular(pObj)) )
            Abc_NtkDfs_iter( vStack, Abc_ObjRegular(pObj), vNodes );
    Vec_PtrFree( vStack );
    return vNodes;
}